

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

bool lexer_CaptureRept(CaptureBody *capture)

{
  uint uVar1;
  int iVar2;
  LexerState *pLVar3;
  bool bVar4;
  long lVar5;
  
  startCapture(capture);
  if (lexerState->atLineStart != true) {
    __assert_fail("lexerState->atLineStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,0x9ba,"lexer_CaptureRept");
  }
  lVar5 = 0;
LAB_0010db8d:
  do {
    pLVar3 = lexerState;
    lexerState->lineNo = lexerState->lineNo + 1;
    pLVar3->colNo = 1;
    uVar1 = peek();
    while (uVar1 != 0xffffffff) {
      shiftChar();
      if ((uVar1 != 0x20) && (uVar1 != 9)) {
        if ((0x19 < (uVar1 & 0xffffffdf) - 0x41) && ((uVar1 != 0x5f && (uVar1 != 0x2e))))
        goto LAB_0010dbc3;
        iVar2 = readIdentifier((char)uVar1);
        pLVar3 = lexerState;
        if (iVar2 - 0x73U < 2) {
          lVar5 = lVar5 + 1;
          goto LAB_0010dbc3;
        }
        if (iVar2 != 0x7b) goto LAB_0010dbc3;
        if (lVar5 != 0) {
          lVar5 = lVar5 + -1;
          goto LAB_0010dbc3;
        }
        lexerState->captureSize = lexerState->captureSize - 4;
        bVar4 = true;
        goto LAB_0010dc50;
      }
      uVar1 = peek();
    }
    uVar1 = 0xffffffff;
LAB_0010dbc3:
    if (uVar1 != 0xd) {
      if (uVar1 == 10) goto LAB_0010db8d;
      if (uVar1 == 0xffffffff) {
        bVar4 = false;
        error("Unterminated REPT/FOR block\n");
        pLVar3 = lexerState;
LAB_0010dc50:
        if (capture->body == (char *)0x0) {
          capture->body = pLVar3->captureBuf;
        }
        capture->size = pLVar3->captureSize;
        pLVar3->capturing = false;
        pLVar3->captureBuf = (char *)0x0;
        pLVar3->disableMacroArgs = false;
        pLVar3->disableInterpolation = false;
        pLVar3->atLineStart = false;
        return bVar4;
      }
      uVar1 = peek();
      if (uVar1 != 0xffffffff) {
        shiftChar();
      }
      goto LAB_0010dbc3;
    }
    iVar2 = peek();
    if (iVar2 == 10) {
      shiftChar();
    }
  } while( true );
}

Assistant:

bool lexer_CaptureRept(struct CaptureBody *capture)
{
	startCapture(capture);

	size_t depth = 0;
	int c = EOF;

	// Due to parser internals, it reads the EOL after the expression before calling this.
	// Thus, we don't need to keep one in the buffer afterwards.
	// The following assertion checks that.
	assert(lexerState->atLineStart);
	for (;;) {
		nextLine();
		// We're at line start, so attempt to match a `REPT` or `ENDR` token
		do { // Discard initial whitespace
			c = nextChar();
		} while (isWhitespace(c));
		// Now, try to match `REPT`, `FOR` or `ENDR` as a **whole** identifier
		if (startsIdentifier(c)) {
			switch (readIdentifier(c)) {
			case T_POP_REPT:
			case T_POP_FOR:
				depth++;
				// Ignore the rest of that line
				break;

			case T_POP_ENDR:
				if (!depth) {
					// The final ENDR has been captured, but we don't want it!
					// We know we have read exactly "ENDR", not e.g. an EQUS
					lexerState->captureSize -= strlen("ENDR");
					goto finish;
				}
				depth--;
			}
		}

		// Just consume characters until EOL or EOF
		for (;; c = nextChar()) {
			if (c == EOF) {
				error("Unterminated REPT/FOR block\n");
				goto finish;
			} else if (c == '\n' || c == '\r') {
				handleCRLF(c);
				break;
			}
		}
	}

finish:
	endCapture(capture);
	// ENDR or EOF puts us past the start of the line
	lexerState->atLineStart = false;

	// Returns true if an ENDR terminated the block, false if it reached EOF first
	return c != EOF;
}